

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O0

int idaNlsResidual(N_Vector ycor,N_Vector res,void *ida_mem)

{
  int iVar1;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDX == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,299,"idaNlsResidual",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x290),in_RDI,
                 *(undefined8 *)(in_RDX + 0x280));
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x508),*(undefined8 *)(in_RDX + 0x298),
                 in_RDI,*(undefined8 *)(in_RDX + 0x288));
    iVar1 = (**(code **)(in_RDX + 0x730))
                      (*(undefined8 *)(in_RDX + 0x4f8),*(undefined8 *)(in_RDX + 0x280),
                       *(undefined8 *)(in_RDX + 0x288),in_RSI,*(undefined8 *)(in_RDX + 0x18));
    *(long *)(in_RDX + 0x5c0) = *(long *)(in_RDX + 0x5c0) + 1;
    N_VScale(0x3ff0000000000000,in_RSI,*(undefined8 *)(in_RDX + 0x2b8));
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int idaNlsResidual(N_Vector ycor, N_Vector res, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* update yy and yp based on the current correction */
  N_VLinearSum(ONE, IDA_mem->ida_yypredict, ONE, ycor, IDA_mem->ida_yy);
  N_VLinearSum(ONE, IDA_mem->ida_yppredict, IDA_mem->ida_cj, ycor,
               IDA_mem->ida_yp);

  /* evaluate residual */
  retval = IDA_mem->nls_res(IDA_mem->ida_tn, IDA_mem->ida_yy, IDA_mem->ida_yp,
                            res, IDA_mem->ida_user_data);

  /* increment the number of residual evaluations */
  IDA_mem->ida_nre++;

  /* save a copy of the residual vector in savres */
  N_VScale(ONE, res, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_RES_FAIL); }
  if (retval > 0) { return (IDA_RES_RECVR); }

  return (IDA_SUCCESS);
}